

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  uchar *puVar2;
  char *errmsg;
  uchar *local_40;
  char *local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = -0x27;
  }
  else {
    local_38 = signame;
    start_time = time((time_t *)0x0);
    do {
      session = channel->session;
      if (channel->sendsignal_state == libssh2_NB_state_created) {
LAB_0011cee6:
        iVar1 = _libssh2_transport_send
                          (session,channel->sendsignal_packet,channel->sendsignal_packet_len,
                           (uchar *)0x0,0);
        if (iVar1 != -0x25) {
          if (iVar1 == 0) {
            (*session->free)(channel->sendsignal_packet,&session->abstract);
            iVar1 = 0;
LAB_0011cf97:
            channel->sendsignal_state = libssh2_NB_state_idle;
            return iVar1;
          }
          (*session->free)(channel->sendsignal_packet,&session->abstract);
          channel->sendsignal_state = libssh2_NB_state_idle;
          errmsg = "Unable to send signal packet";
          goto LAB_0011cf50;
        }
        _libssh2_error(session,-0x25,"Would block sending signal request");
      }
      else {
        if (channel->sendsignal_state != libssh2_NB_state_idle) {
          iVar1 = -0xe;
          goto LAB_0011cf97;
        }
        channel->sendsignal_packet_len = signame_len + 0x14;
        puVar2 = (uchar *)(*session->alloc)(signame_len + 0x14,&session->abstract);
        channel->sendsignal_packet = puVar2;
        if (puVar2 != (uchar *)0x0) {
          local_40 = puVar2 + 1;
          *puVar2 = 'b';
          _libssh2_store_u32(&local_40,(channel->remote).id);
          _libssh2_store_str(&local_40,"signal",6);
          *local_40 = '\0';
          local_40 = local_40 + 1;
          _libssh2_store_str(&local_40,local_38,signame_len);
          channel->sendsignal_state = libssh2_NB_state_created;
          goto LAB_0011cee6;
        }
        iVar1 = -6;
        errmsg = "Unable to allocate memory for signal request";
LAB_0011cf50:
        iVar1 = _libssh2_error(session,iVar1,errmsg);
        if (iVar1 != -0x25) {
          return iVar1;
        }
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_signal(channel, signame, signame_len));
    return rc;
}